

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-pprint.cc
# Opt level: O1

void value_type_pprint_test(void)

{
  int iVar1;
  normal3f *v_00;
  normal3f v;
  stringstream ss;
  long *local_1b8;
  undefined4 local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [7];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::operator<<((ostream *)(local_198 + 0x10),Vertex);
  std::__cxx11::stringbuf::str();
  iVar1 = std::__cxx11::string::compare((char *)&local_1b8);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-pprint.cc"
                 ,0x16,"%s","ss.str() == \"vertex\"");
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  local_1b8 = (long *)0x400000003f800000;
  local_1b0 = 0x40400000;
  tinyusdz::to_string_abi_cxx11_((string *)local_198,(tinyusdz *)&local_1b8,v_00);
  iVar1 = std::__cxx11::string::compare((char *)local_198);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-pprint.cc"
                 ,0x1c,"%s","s == \"(1, 2, 3)\"");
  if ((ostream *)local_198._0_8_ != (ostream *)(local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void value_type_pprint_test(void) {

  {
    std::stringstream ss;
    tinyusdz::Interpolation interp = tinyusdz::Interpolation::Vertex;
    ss << interp;
    TEST_CHECK(ss.str() == "vertex");
  }

  {
    value::normal3f v{1.0f, 2.0f, 3.f};
    std::string s = to_string(v);
    TEST_CHECK(s == "(1, 2, 3)");
  }
}